

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O2

void * FilterRender::render(void *data,uint width,uint height,Config *config)

{
  Filter *pFVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  vector<Geometry::Point,_std::allocator<Geometry::Point>_> local_48;
  
  if (config != (Config *)0x0) {
    uVar4 = 0;
    uVar5 = (ulong)config->nFilters;
    if ((int)config->nFilters < 1) {
      uVar5 = uVar4;
    }
    while (uVar5 != uVar4) {
      uVar2 = (**config->filters[uVar4]->_vptr_Filter)();
      switch(uVar2 & 0xff) {
      case 0:
        doFlip(data,width,height,*(bool *)&config->filters[uVar4][1]._vptr_Filter);
      case 2:
        pFVar1 = config->filters[uVar4];
        doColor(data,width,height,*(u_int8_t *)&pFVar1[1]._vptr_Filter,
                *(u_int8_t *)((long)&pFVar1[1]._vptr_Filter + 1),
                *(u_int8_t *)((long)&pFVar1[1]._vptr_Filter + 2),'\0');
      case 3:
        doAuto(data,width,height);
      case 1:
        std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::vector
                  (&local_48,
                   (vector<Geometry::Point,_std::allocator<Geometry::Point>_> *)
                   (config->filters[uVar4] + 1));
        pvVar3 = doSlice(data,width,height,&local_48);
        std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::~vector(&local_48);
        _Unwind_Resume(pvVar3);
      default:
        uVar4 = uVar4 + 1;
      }
    }
  }
  return data;
}

Assistant:

void* FilterRender::render(void *data, uint width, uint height, Config *config) {

	//data = FilterRender::doColor(data, width, height, time(0)%255, time(0)*2%255, time(0)*3%255, 255);

	if(config == NULL) return data;
	int n = config->nFilters;

	for(int i=0;i<n;++i)
	{
		switch (config->filters[i]->type())
		{
			case 0:
			{
				FilterFlip *f = (FilterFlip*)config->filters[i];
				data = FilterRender::doFlip(data, width, height, f->isLR);
				break;
			}
			case 1:
			{
				FilterSlicer *f = (FilterSlicer*)config->filters[i];
				data = FilterRender::doSlice(data, width, height, f->poly);
				break;
			}
			case 2:
			{
				FilterColor *f = (FilterColor*)config->filters[i];
				data = FilterRender::doColor(data, width, height, f->r, f->g, f->b, f->a);
				break;
			}
			case 3:
			{
				FilterAuto *f = (FilterAuto*)config->filters[i];
				data = FilterRender::doAuto(data, width, height);
				break;
			}

		}

	}
	return data;
}